

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QDockWidget_*>::data(QList<QDockWidget_*> *this)

{
  QArrayDataPointer<QDockWidget_*> *this_00;
  QDockWidget **ppQVar1;
  QArrayDataPointer<QDockWidget_*> *in_RDI;
  
  detach((QList<QDockWidget_*> *)0x58426c);
  this_00 = (QArrayDataPointer<QDockWidget_*> *)QArrayDataPointer<QDockWidget_*>::operator->(in_RDI)
  ;
  ppQVar1 = QArrayDataPointer<QDockWidget_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }